

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::CopyPropagateArrays::HasNoStores(CopyPropagateArrays *this,Instruction *ptr_inst)

{
  IRContext *this_00;
  bool bVar1;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp:207:53)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp:207:53)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  bVar1 = analysis::DefUseManager::WhileEachUser
                    ((this_00->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,ptr_inst,
                     (function<bool_(spvtools::opt::Instruction_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return bVar1;
}

Assistant:

bool CopyPropagateArrays::HasNoStores(Instruction* ptr_inst) {
  return get_def_use_mgr()->WhileEachUser(ptr_inst, [this](Instruction* use) {
    if (use->opcode() == spv::Op::OpLoad) {
      return true;
    } else if (use->opcode() == spv::Op::OpAccessChain) {
      return HasNoStores(use);
    } else if (use->IsDecoration() || use->opcode() == spv::Op::OpName) {
      return true;
    } else if (use->opcode() == spv::Op::OpStore) {
      return false;
    } else if (use->opcode() == spv::Op::OpImageTexelPointer) {
      return true;
    } else if (use->opcode() == spv::Op::OpEntryPoint) {
      return true;
    } else if (IsInterpolationInstruction(use)) {
      return true;
    }
    // Some other instruction.  Be conservative.
    return false;
  });
}